

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void duckdb::UnionVector::SetToMember
               (Vector *union_vector,union_tag_t tag,Vector *member_vector,idx_t count,
               bool keep_tags_for_null)

{
  unsigned_long *puVar1;
  Vector *pVVar2;
  idx_t iVar3;
  undefined7 in_register_00000031;
  idx_t i;
  ulong member_index;
  ulong member_index_00;
  bool bVar4;
  
  member_index_00 = CONCAT71(in_register_00000031,tag) & 0xffffffff;
  pVVar2 = GetMember(union_vector,member_index_00);
  Vector::Reference(pVVar2,member_vector);
  pVVar2 = GetTags(union_vector);
  if (member_vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(union_vector,CONSTANT_VECTOR);
    *pVVar2->data = tag;
    if (keep_tags_for_null) {
      ConstantVector::SetNull(union_vector,false);
      bVar4 = false;
    }
    else {
      puVar1 = (member_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        bVar4 = false;
      }
      else {
        bVar4 = (*puVar1 & 1) == 0;
      }
      ConstantVector::SetNull(union_vector,bVar4);
      puVar1 = (member_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        bVar4 = false;
      }
      else {
        bVar4 = (*puVar1 & 1) == 0;
      }
    }
    ConstantVector::SetNull(pVVar2,bVar4);
  }
  else {
    Vector::Flatten(member_vector,count);
    Vector::SetVectorType(union_vector,FLAT_VECTOR);
    if ((member_vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      Vector::SetVectorType(pVVar2,CONSTANT_VECTOR);
      *pVVar2->data = tag;
    }
    else {
      Vector::SetVectorType(pVVar2,FLAT_VECTOR);
      if (keep_tags_for_null) {
        FlatVector::VerifyFlatVector(pVVar2);
        TemplatedValidityMask<unsigned_long>::SetAllValid
                  (&(pVVar2->validity).super_TemplatedValidityMask<unsigned_long>,count);
        FlatVector::VerifyFlatVector(union_vector);
        TemplatedValidityMask<unsigned_long>::SetAllValid
                  (&(union_vector->validity).super_TemplatedValidityMask<unsigned_long>,count);
      }
      else {
        FlatVector::VerifyFlatVector(member_vector);
        FlatVector::VerifyFlatVector(union_vector);
        TemplatedValidityMask<unsigned_long>::operator=
                  (&(union_vector->validity).super_TemplatedValidityMask<unsigned_long>,
                   &(member_vector->validity).super_TemplatedValidityMask<unsigned_long>);
        FlatVector::VerifyFlatVector(member_vector);
        FlatVector::VerifyFlatVector(pVVar2);
        TemplatedValidityMask<unsigned_long>::operator=
                  (&(pVVar2->validity).super_TemplatedValidityMask<unsigned_long>,
                   &(member_vector->validity).super_TemplatedValidityMask<unsigned_long>);
      }
      switchD_016d8eb1::default(pVVar2->data,(uint)CONCAT71(in_register_00000031,tag) & 0xff,count);
    }
  }
  for (member_index = 0; iVar3 = UnionType::GetMemberCount(&union_vector->type),
      member_index < iVar3; member_index = member_index + 1) {
    if (member_index_00 != member_index) {
      pVVar2 = GetMember(union_vector,member_index);
      Vector::SetVectorType(pVVar2,CONSTANT_VECTOR);
      ConstantVector::SetNull(pVVar2,true);
    }
  }
  return;
}

Assistant:

void UnionVector::SetToMember(Vector &union_vector, union_tag_t tag, Vector &member_vector, idx_t count,
                              bool keep_tags_for_null) {
	D_ASSERT(union_vector.GetType().id() == LogicalTypeId::UNION);
	D_ASSERT(tag < UnionType::GetMemberCount(union_vector.GetType()));

	// Set the union member to the specified vector
	UnionVector::GetMember(union_vector, tag).Reference(member_vector);
	auto &tag_vector = UnionVector::GetTags(union_vector);

	if (member_vector.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		// if the member vector is constant, we can set the union to constant as well
		union_vector.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::GetData<union_tag_t>(tag_vector)[0] = tag;
		if (keep_tags_for_null) {
			ConstantVector::SetNull(union_vector, false);
			ConstantVector::SetNull(tag_vector, false);
		} else {
			ConstantVector::SetNull(union_vector, ConstantVector::IsNull(member_vector));
			ConstantVector::SetNull(tag_vector, ConstantVector::IsNull(member_vector));
		}

	} else {
		// otherwise flatten and set to flatvector
		member_vector.Flatten(count);
		union_vector.SetVectorType(VectorType::FLAT_VECTOR);

		if (member_vector.validity.AllValid()) {
			// if the member vector is all valid, we can set the tag to constant
			tag_vector.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto tag_data = ConstantVector::GetData<union_tag_t>(tag_vector);
			*tag_data = tag;
		} else {
			tag_vector.SetVectorType(VectorType::FLAT_VECTOR);
			if (keep_tags_for_null) {
				FlatVector::Validity(tag_vector).SetAllValid(count);
				FlatVector::Validity(union_vector).SetAllValid(count);
			} else {
				// ensure the tags have the same validity as the member
				FlatVector::Validity(union_vector) = FlatVector::Validity(member_vector);
				FlatVector::Validity(tag_vector) = FlatVector::Validity(member_vector);
			}

			auto tag_data = FlatVector::GetData<union_tag_t>(tag_vector);
			memset(tag_data, tag, count);
		}
	}

	// Set the non-selected members to constant null vectors
	for (idx_t i = 0; i < UnionType::GetMemberCount(union_vector.GetType()); i++) {
		if (i != tag) {
			auto &member = UnionVector::GetMember(union_vector, i);
			member.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(member, true);
		}
	}
}